

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedefNameTypeResolver.cpp
# Opt level: O0

Action __thiscall
psy::C::TypedefNameTypeResolver::visitIdentifierDeclarator
          (TypedefNameTypeResolver *this,IdentifierDeclaratorSyntax *node)

{
  SymbolKind SVar1;
  int iVar2;
  Symbol *this_00;
  ostream *poVar3;
  undefined4 extraout_var;
  Type *pTVar4;
  TypedefNameType *this_01;
  TypedefNameType *tydefNameTy;
  Type *resolvedTy;
  TypedefDeclarationSymbol *tydefDecl;
  DeclarationSymbol *decl;
  IdentifierDeclaratorSyntax *node_local;
  TypedefNameTypeResolver *this_local;
  
  if ((this->inTydefDecltor_ & 1U) == 0) {
    this_local._7_1_ = Skip;
  }
  else {
    this_00 = &SemanticModel::declarationBy(this->semaModel_,&node->super_DeclaratorSyntax)->
               super_Symbol;
    if (this_00 == (Symbol *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypedefNameTypeResolver.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x40);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,"<empty message>");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = Quit;
    }
    else {
      SVar1 = Symbol::kind(this_00);
      if (SVar1 == TypedefDeclaration) {
        iVar2 = (*this_00->_vptr_Symbol[0x22])();
        pTVar4 = TypedefDeclarationSymbol::synonymizedType
                           ((TypedefDeclarationSymbol *)CONCAT44(extraout_var,iVar2));
        pTVar4 = resolve(this,pTVar4);
        this_01 = TypedefDeclarationSymbol::introducedSynonymType
                            ((TypedefDeclarationSymbol *)CONCAT44(extraout_var,iVar2));
        TypedefNameType::setResolvedSynonymizedType(this_01,pTVar4);
        this_local._7_1_ = Skip;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypedefNameTypeResolver.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x41);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = std::operator<<(poVar3,"<empty message>");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = Quit;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

SyntaxVisitor::Action TypedefNameTypeResolver::visitIdentifierDeclarator(
        const IdentifierDeclaratorSyntax* node)
{
    if (!inTydefDecltor_)
        return Action::Skip;

    auto decl = semaModel_->declarationBy(node);
    PSY_ASSERT_2(decl, return Action::Quit);
    PSY_ASSERT_2(decl->kind() == SymbolKind::TypedefDeclaration, return Action::Quit);
    auto tydefDecl = decl->asTypedefDeclaration();
    auto resolvedTy = resolve(tydefDecl->synonymizedType());
    auto tydefNameTy = tydefDecl->introducedSynonymType();
    const_cast<TypedefNameType*>(tydefNameTy)->setResolvedSynonymizedType(resolvedTy);

    return Action::Skip;
}